

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_view_pool.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::file_view_entry::file_view_entry
          (file_view_entry *this,file_id k,string_view name,open_mode_t m,int64_t size)

{
  time_point tVar1;
  file_handle local_3c;
  int64_t local_38;
  int64_t size_local;
  file_view_entry *this_local;
  size_t sStack_20;
  open_mode_t m_local;
  string_view name_local;
  file_id k_local;
  
  sStack_20 = name._M_len;
  this->key = k;
  local_38 = size;
  size_local = (int64_t)this;
  this_local._4_4_ = m.m_val;
  file_handle::file_handle(&local_3c,name,size,m);
  ::std::
  make_shared<libtorrent::aux::file_mapping,libtorrent::aux::file_handle,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>const&,long_const&>
            ((file_handle *)&this->mapping,
             (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void> *)&local_3c,
             (long *)((long)&this_local + 4));
  file_handle::~file_handle(&local_3c);
  tVar1 = time_now();
  (this->last_use).__d.__r = (rep)tVar1.__d.__r;
  (this->mode).m_val = this_local._4_4_;
  return;
}

Assistant:

file_view_entry(file_id k
			, string_view name
			, open_mode_t const m
			, std::int64_t const size
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
			, std::shared_ptr<std::mutex> open_unmap_lock
#endif
			)
			: key(k)
			, mapping(std::make_shared<file_mapping>(file_handle(name, size, m), m, size
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				))
			, mode(m)
		{}